

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.hpp
# Opt level: O3

double __thiscall lightconf::scanner::expect_number(scanner *this)

{
  undefined8 *puVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  pointer pcVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  int iVar11;
  token_type tVar12;
  long *plVar13;
  undefined8 *puVar14;
  ulong uVar15;
  runtime_error *this_00;
  long *plVar16;
  ulong *puVar17;
  token *extraout_RDX;
  token *extraout_RDX_00;
  token *extraout_RDX_01;
  token *extraout_RDX_02;
  token *ptVar18;
  undefined8 uVar19;
  ulong uVar20;
  undefined8 uVar21;
  pointer ptVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  token tok;
  token tok_1;
  token tok_2;
  ulong *local_1d8;
  token *local_1d0;
  ulong local_1c8;
  undefined4 uStack_1c0;
  undefined4 uStack_1bc;
  undefined8 *local_1b8;
  undefined8 local_1b0;
  undefined8 local_1a8;
  undefined4 uStack_1a0;
  undefined4 uStack_19c;
  double local_198;
  token_type local_190 [2];
  undefined1 *local_188;
  undefined8 local_180;
  undefined1 local_178 [16];
  double local_168;
  uint uStack_160;
  undefined4 uStack_15c;
  undefined4 uStack_158;
  undefined4 local_154;
  string local_150;
  token_type local_130;
  undefined1 *local_128;
  undefined8 local_120;
  undefined1 local_118 [16];
  double local_108;
  uint uStack_100;
  int iStack_fc;
  undefined4 uStack_f8;
  undefined4 local_f4;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  token_type local_d0;
  undefined1 *local_c8;
  undefined8 local_c0;
  undefined1 local_b8 [16];
  double local_a8;
  uint uStack_a0;
  int iStack_9c;
  undefined4 uStack_98;
  undefined4 uStack_94;
  string local_90;
  token_type local_70 [2];
  undefined1 *local_68;
  undefined8 local_60;
  undefined1 local_58 [16];
  double local_48;
  uint uStack_40;
  undefined4 uStack_3c;
  undefined4 uStack_38;
  undefined4 uStack_34;
  
  skip_whitespace(this,false);
  uVar15 = (ulong)this->cur_token_;
  ptVar22 = (this->tokens_).super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ptVar18 = extraout_RDX;
  if ((long)(this->tokens_).super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>.
            _M_impl.super__Vector_impl_data._M_finish - (long)ptVar22 >> 6 != uVar15) {
    local_70[0] = ptVar22[uVar15].type;
    pcVar6 = ptVar22[uVar15].string_value._M_dataplus._M_p;
    local_68 = local_58;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_68,pcVar6,pcVar6 + ptVar22[uVar15].string_value._M_string_length);
    tVar12 = local_70[0];
    uVar2 = ptVar22[uVar15].line;
    uVar7 = ptVar22[uVar15].col;
    local_48 = ptVar22[uVar15].number_value;
    uVar21 = (&ptVar22[uVar15].number_value)[1];
    uStack_40 = (uint)uVar21;
    uStack_3c = (undefined4)((ulong)uVar21 >> 0x20);
    ptVar18 = extraout_RDX_00;
    uStack_38 = uVar2;
    uStack_34 = uVar7;
    if (local_68 != local_58) {
      operator_delete(local_68);
      ptVar18 = extraout_RDX_01;
    }
    if (tVar12 == number_token) {
      uVar15 = (ulong)this->cur_token_;
      ptVar22 = (this->tokens_).
                super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
                super__Vector_impl_data._M_start;
      uVar23 = 0;
      uVar24 = 0;
      if ((long)(this->tokens_).
                super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)ptVar22 >> 6 != uVar15) {
        local_70[0] = ptVar22[uVar15].type;
        pcVar6 = ptVar22[uVar15].string_value._M_dataplus._M_p;
        local_68 = local_58;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_68,pcVar6,pcVar6 + ptVar22[uVar15].string_value._M_string_length
                  );
        local_198 = ptVar22[uVar15].number_value;
        uVar21 = (&ptVar22[uVar15].number_value)[1];
        uStack_40 = (uint)uVar21;
        uStack_3c = (undefined4)((ulong)uVar21 >> 0x20);
        uVar3 = ptVar22[uVar15].line;
        uVar8 = ptVar22[uVar15].col;
        uVar23 = SUB84(local_198,0);
        uVar24 = (undefined4)((ulong)local_198 >> 0x20);
        if (local_68 != local_58) {
          local_48 = local_198;
          uStack_38 = uVar3;
          uStack_34 = uVar8;
          operator_delete(local_68);
          uVar23 = SUB84(local_198,0);
          uVar24 = (undefined4)((ulong)local_198 >> 0x20);
        }
      }
      if ((ulong)this->cur_token_ <=
          ((long)(this->tokens_).
                 super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(this->tokens_).
                 super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
                 super__Vector_impl_data._M_start >> 6) - 1U) {
        this->cur_token_ = this->cur_token_ + 1;
      }
      return (double)CONCAT44(uVar24,uVar23);
    }
  }
  local_68 = local_58;
  local_70[0] = 3;
  local_60 = 0;
  local_58[0] = 0;
  local_48 = 0.0;
  uStack_40 = uStack_40 & 0xffffff00;
  uStack_3c = 0;
  uStack_38 = 0;
  uStack_34 = 0;
  token_name_abi_cxx11_(&local_90,(lightconf *)local_70,ptVar18);
  plVar13 = (long *)std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,0x11a84b);
  local_f0 = (long *)*plVar13;
  plVar16 = plVar13 + 2;
  if (local_f0 == plVar16) {
    local_e0 = *plVar16;
    lStack_d8 = plVar13[3];
    local_f0 = &local_e0;
  }
  else {
    local_e0 = *plVar16;
  }
  local_e8 = plVar13[1];
  *plVar13 = (long)plVar16;
  plVar13[1] = 0;
  *(undefined1 *)(plVar13 + 2) = 0;
  plVar13 = (long *)std::__cxx11::string::append((char *)&local_f0);
  local_1d8 = (ulong *)*plVar13;
  puVar17 = (ulong *)(plVar13 + 2);
  if (local_1d8 == puVar17) {
    local_1c8 = *puVar17;
    uStack_1c0 = (undefined4)plVar13[3];
    uStack_1bc = *(undefined4 *)((long)plVar13 + 0x1c);
    local_1d8 = &local_1c8;
  }
  else {
    local_1c8 = *puVar17;
  }
  ptVar18 = (token *)plVar13[1];
  *plVar13 = (long)puVar17;
  plVar13[1] = 0;
  *(undefined1 *)(plVar13 + 2) = 0;
  uVar15 = (ulong)this->cur_token_;
  ptVar22 = (this->tokens_).super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>.
            _M_impl.super__Vector_impl_data._M_start;
  local_1d0 = ptVar18;
  if ((long)(this->tokens_).super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>.
            _M_impl.super__Vector_impl_data._M_finish - (long)ptVar22 >> 6 == uVar15) {
    local_188 = local_178;
    local_180 = 0;
    local_178[0] = 0;
    local_168 = 0.0;
    uStack_160 = uStack_160 & 0xffffff00;
    uStack_15c = 0;
    uStack_158 = 0;
    local_154 = 0;
    local_190[0] = eof_token;
  }
  else {
    local_190[0] = ptVar22[uVar15].type;
    local_188 = local_178;
    pcVar6 = ptVar22[uVar15].string_value._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_188,pcVar6,pcVar6 + ptVar22[uVar15].string_value._M_string_length);
    uVar4 = ptVar22[uVar15].line;
    uVar9 = ptVar22[uVar15].col;
    local_168 = ptVar22[uVar15].number_value;
    ptVar22 = ptVar22 + uVar15;
    uVar21._0_1_ = ptVar22->char_value;
    uVar21._1_3_ = *(undefined3 *)&ptVar22->field_0x31;
    uVar21._4_4_ = ptVar22->pos;
    uStack_160 = (uint)uVar21;
    ptVar18 = extraout_RDX_02;
    uStack_15c = uVar21._4_4_;
    uStack_158 = uVar4;
    local_154 = uVar9;
  }
  token_name_abi_cxx11_(&local_150,(lightconf *)local_190,ptVar18);
  uVar15 = (long)&local_1d0->type + local_150._M_string_length;
  uVar20 = 0xf;
  if (local_1d8 != &local_1c8) {
    uVar20 = local_1c8;
  }
  if (uVar20 < uVar15) {
    uVar21 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &local_150.field_2) {
      uVar21 = local_150.field_2._M_allocated_capacity;
    }
    if (uVar15 <= (ulong)uVar21) {
      puVar14 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_150,0,(char *)0x0,(ulong)local_1d8);
      goto LAB_00110428;
    }
  }
  puVar14 = (undefined8 *)
            std::__cxx11::string::_M_append((char *)&local_1d8,(ulong)local_150._M_dataplus._M_p);
LAB_00110428:
  local_1b8 = (undefined8 *)*puVar14;
  puVar1 = puVar14 + 2;
  if (local_1b8 == puVar1) {
    local_1a8 = *puVar1;
    uStack_1a0 = *(undefined4 *)(puVar14 + 3);
    uStack_19c = *(undefined4 *)((long)puVar14 + 0x1c);
    local_1b8 = &local_1a8;
  }
  else {
    local_1a8 = *puVar1;
  }
  local_1b0 = puVar14[1];
  *puVar14 = puVar1;
  puVar14[1] = 0;
  *(undefined1 *)puVar1 = 0;
  uVar20 = (ulong)this->cur_token_;
  ptVar22 = (this->tokens_).super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>.
            _M_impl.super__Vector_impl_data._M_start;
  uVar15 = (long)(this->tokens_).
                 super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
                 super__Vector_impl_data._M_finish - (long)ptVar22 >> 6;
  if (uVar15 == uVar20) {
    local_128 = local_118;
    uVar19 = 0;
    local_120 = 0;
    local_118[0] = 0;
    local_108 = 0.0;
    uStack_100 = uStack_100 & 0xffffff00;
    iStack_fc = 0;
    uStack_f8 = 0;
    local_f4 = 0;
    local_130 = eof_token;
  }
  else {
    local_130 = ptVar22[uVar20].type;
    local_128 = local_118;
    pcVar6 = ptVar22[uVar20].string_value._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_128,pcVar6,pcVar6 + ptVar22[uVar20].string_value._M_string_length);
    uVar19._0_4_ = ptVar22[uVar20].line;
    uVar19._4_4_ = ptVar22[uVar20].col;
    local_108 = ptVar22[uVar20].number_value;
    uStack_100 = *(uint *)&ptVar22[uVar20].char_value;
    iStack_fc = ptVar22[uVar20].pos;
    uVar20 = (ulong)this->cur_token_;
    ptVar22 = (this->tokens_).
              super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
              super__Vector_impl_data._M_start;
    uVar15 = (long)(this->tokens_).
                   super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)ptVar22 >> 6;
    uStack_f8 = (undefined4)uVar19;
    local_f4 = uVar19._4_4_;
  }
  if (uVar15 == uVar20) {
    local_c8 = local_b8;
    local_c0 = 0;
    local_b8[0] = 0;
    local_a8 = 0.0;
    uStack_a0 = uStack_a0 & 0xffffff00;
    iStack_9c = 0;
    uStack_98 = 0;
    uStack_94 = 0;
    local_d0 = eof_token;
  }
  else {
    local_d0 = ptVar22[uVar20].type;
    local_c8 = local_b8;
    pcVar6 = ptVar22[uVar20].string_value._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_c8,pcVar6,pcVar6 + ptVar22[uVar20].string_value._M_string_length);
    local_a8 = ptVar22[uVar20].number_value;
    uStack_a0 = *(uint *)&ptVar22[uVar20].char_value;
    iStack_9c = ptVar22[uVar20].pos;
    uVar5 = ptVar22[uVar20].line;
    uVar10 = ptVar22[uVar20].col;
    uStack_98 = uVar5;
    uStack_94 = uVar10;
  }
  iVar11 = iStack_9c;
  this_00 = (runtime_error *)__cxa_allocate_exception(0x18);
  std::runtime_error::runtime_error(this_00,(string *)&local_1b8);
  *(undefined ***)this_00 = &PTR__runtime_error_00120cb8;
  *(int *)(this_00 + 0x10) = (int)uVar19;
  *(int *)(this_00 + 0x14) = iVar11;
  __cxa_throw(this_00,&parse_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline double scanner::expect_number() {
    skip_whitespace(false);
    if (cur_token().type != token_type::number_token) {
        fail("expected " + token_name(token(token_type::number_token)) + " but found " + token_name(cur_token()),
            cur_token().line, cur_token().pos);
    }
    double val = cur_token().number_value;
    next_token();
    return val;
}